

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O2

double xc_bessel_K0(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (x <= 0.0) {
    fwrite("Domain error in bessel_K0\n",0x1a,1,_stderr);
    dVar2 = 0.0;
  }
  else if (x <= 2.0) {
    dVar1 = log(x * 0.5);
    dVar3 = xc_bessel_I0(x);
    dVar2 = xc_cheb_eval(x * 0.5 * x + -1.0,bk0_data,0xb);
    dVar2 = dVar2 + (-0.25 - dVar3 * dVar1);
  }
  else {
    dVar1 = exp(-x);
    dVar2 = xc_bessel_K0_scaled(x);
    dVar2 = dVar2 * dVar1;
  }
  return dVar2;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K0(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K0\n");
#endif
  } else if(x <= 2.0)
    r = -log(0.5*x)*xc_bessel_I0(x) - 0.25 + xc_cheb_eval(0.5*x*x - 1.0, bk0_data, 11);
  else
    r = exp(-x)*xc_bessel_K0_scaled(x);

  return r;
}